

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branching.cpp
# Opt level: O1

void branch(vec<Branching_*> *x,VarBranch var_branch,ValBranch val_branch)

{
  BranchGroup *pBVar1;
  ulong uVar2;
  BranchGroup *pBVar3;
  ulong uVar4;
  vec<Branching_*> local_38;
  
  pBVar1 = engine.branching;
  local_38.sz = x->sz;
  uVar4 = (ulong)local_38.sz;
  local_38.cap = local_38.sz;
  local_38.data = (Branching **)malloc(uVar4 * 8);
  if (uVar4 != 0) {
    uVar2 = 0;
    do {
      local_38.data[uVar2] = x->data[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar4 != uVar2);
  }
  pBVar3 = createBranch(&local_38,var_branch,val_branch);
  (*(pBVar1->super_Branching)._vptr_Branching[3])(pBVar1,pBVar3);
  if (local_38.data != (Branching **)0x0) {
    free(local_38.data);
  }
  return;
}

Assistant:

void branch(vec<Branching*> x, VarBranch var_branch, ValBranch val_branch) {
	engine.branching->add(createBranch(x, var_branch, val_branch));
}